

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O0

Value * duckdb::PragmaFunctionExtractor::GetParameterTypes
                  (PragmaFunctionCatalogEntry *entry,idx_t offset)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Value *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *param;
  iterator __end2;
  iterator __begin2;
  named_parameter_type_map_t *__range2;
  idx_t i;
  PragmaFunction fun;
  vector<duckdb::Value,_true> results;
  LogicalType *in_stack_000003f8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *in_stack_fffffffffffffde8;
  PragmaFunction *in_stack_fffffffffffffdf0;
  FunctionSet<duckdb::PragmaFunction> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  Value *pVVar3;
  pointer in_stack_fffffffffffffe10;
  string local_1c0 [32];
  reference local_1a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  local_198;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  local_190;
  undefined1 *local_188;
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  vector<duckdb::Value,_true> *in_stack_fffffffffffffec0;
  LogicalType *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_100 [6];
  undefined1 auStack_68 [104];
  
  pVVar3 = in_RDI;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x145e6c9);
  FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
            (in_stack_fffffffffffffdf8,(idx_t)in_stack_fffffffffffffdf0);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __args = local_160;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                       (local_100);
    if (pbVar2 <= __args) break;
    in_stack_fffffffffffffdf0 =
         (PragmaFunction *)
         vector<duckdb::LogicalType,_true>::operator[]
                   ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffdf0,
                    (size_type)in_stack_fffffffffffffde8);
    LogicalType::ToString_abi_cxx11_(in_stack_000003f8);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_RDI,__args);
    ::std::__cxx11::string::~string(local_180);
    local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_160->field_0x1;
  }
  local_188 = auStack_68;
  local_190._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ::begin(in_stack_fffffffffffffde8);
  local_198._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
       ::end(in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = ::std::__detail::operator!=(&local_190,&local_198);
    if (!bVar1) break;
    local_1a0 = ::std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_false,_true>
                             *)0x145e857);
    LogicalType::ToString_abi_cxx11_(in_stack_000003f8);
    ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::emplace_back<std::__cxx11::string>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_RDI,__args);
    ::std::__cxx11::string::~string(local_1c0);
    ::std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_false,_true>
                  *)in_stack_fffffffffffffdf0);
  }
  LogicalType::LogicalType(&in_stack_fffffffffffffe10->type_,(LogicalTypeId)((ulong)pVVar3 >> 0x38))
  ;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffdf0,
             (vector<duckdb::Value,_true> *)&stack0xfffffffffffffe10);
  Value::LIST(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x145e907);
  LogicalType::~LogicalType((LogicalType *)0x145e911);
  PragmaFunction::~PragmaFunction(in_stack_fffffffffffffdf0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x145e92b);
  return pVVar3;
}

Assistant:

static Value GetParameterTypes(PragmaFunctionCatalogEntry &entry, idx_t offset) {
		vector<Value> results;
		auto fun = entry.functions.GetFunctionByOffset(offset);

		for (idx_t i = 0; i < fun.arguments.size(); i++) {
			results.emplace_back(fun.arguments[i].ToString());
		}
		for (auto &param : fun.named_parameters) {
			results.emplace_back(param.second.ToString());
		}
		return Value::LIST(LogicalType::VARCHAR, std::move(results));
	}